

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_tesselation_evaluation_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  bool *pbVar2;
  uint uVar3;
  attributeDefinition *paVar4;
  ostream *poVar5;
  GLuint GVar6;
  GLuint n_components;
  char *pcVar7;
  ulong uVar8;
  undefined *puVar9;
  undefined8 *puVar10;
  char *attribute_name_prefix;
  long lVar11;
  bool bVar12;
  bool *local_218;
  char *local_210;
  string sampling_code;
  string local_1d8 [32];
  stringstream stream;
  ostream local_1a8;
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  attribute_name_prefix = "vs_out_";
  if ((uVar3 & 0x300) == 0) {
    attribute_name_prefix = "tcs_out_";
  }
  sampling_function_00 = *sampling_function;
  uVar8 = (ulong)sampling_function_00;
  lVar11 = 0;
  puVar9 = (undefined *)0x0;
  if (uVar8 < 4) {
    lVar11 = *(long *)(&DAT_017c67d8 + uVar8 * 8);
    puVar9 = (&PTR_texture_attributes_01dfc838)[uVar8];
  }
  sVar1 = *sampler_type;
  paVar4 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar4 = (attributeDefinition *)0x0;
  }
  local_210 = (GLchar *)0x0;
  local_218 = (bool *)0x0;
  pbVar2 = local_218;
  local_218 = (bool *)0x1784ba1;
  GVar6 = 4;
  pcVar7 = (char *)0x0;
  n_components = 0;
  switch(sVar1) {
  case Float:
    pcVar7 = "samplerCubeArray ";
    local_218 = fixed_sample_locations_values + 1;
    local_210 = "vec4 ";
    n_components = GVar6;
    pbVar2 = local_218;
    break;
  case Int:
    pcVar7 = "isamplerCubeArray ";
    local_210 = "ivec4 ";
    n_components = GVar6;
    pbVar2 = local_218;
    break;
  case UInt:
    local_210 = "uvec4 ";
    pcVar7 = "usamplerCubeArray ";
    n_components = GVar6;
    pbVar2 = local_218;
    break;
  case Depth:
    local_210 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x16ae357,sampling_function_00,"float ",1,
               attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",&sampling_code);
    local_218 = fixed_sample_locations_values + 1;
    pcVar7 = "samplerCubeArrayShadow ";
    goto LAB_00d3f0e4;
  case Stencil:
    local_210 = "uint ";
    pcVar7 = "usamplerCubeArray ";
    n_components = 1;
    pbVar2 = local_218;
  }
  local_218 = pbVar2;
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x16ae357,sampling_function_00,local_210,
             n_components,attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",
             &sampling_code);
LAB_00d3f0e4:
  poVar5 = std::operator<<(&local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar5 = std::operator<<(poVar5,"${TESSELLATION_SHADER_REQUIRE}\n");
  poVar5 = std::operator<<(poVar5,"precision highp float;\n");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"/* Sampling tesselation evaluation shader */");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(&local_1a8,"layout(isolines, point_mode) in;\n\n");
  poVar5 = std::operator<<(&local_1a8,"uniform ");
  poVar5 = std::operator<<(poVar5,"highp ");
  poVar5 = std::operator<<(poVar5,pcVar7);
  poVar5 = std::operator<<(poVar5,"sampler");
  poVar5 = std::operator<<(poVar5,";");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(&local_1a8);
  puVar10 = (undefined8 *)(puVar9 + 8);
  while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
    poVar5 = std::operator<<(&local_1a8,"in ");
    poVar5 = std::operator<<(poVar5,(char *)*puVar10);
    poVar5 = std::operator<<(poVar5,attribute_name_prefix);
    poVar5 = std::operator<<(poVar5,(char *)puVar10[-1]);
    poVar5 = std::operator<<(poVar5,"[];");
    std::endl<char,std::char_traits<char>>(poVar5);
    puVar10 = puVar10 + 3;
  }
  if (sVar1 == Depth) {
    bVar12 = true;
    lVar11 = 0;
    while (bVar12) {
      poVar5 = std::operator<<(&local_1a8,"in ");
      poVar5 = std::operator<<(poVar5,paVar4[lVar11].type);
      poVar5 = std::operator<<(poVar5,attribute_name_prefix);
      poVar5 = std::operator<<(poVar5,paVar4[lVar11].name);
      poVar5 = std::operator<<(poVar5,"[];");
      bVar12 = false;
      std::endl<char,std::char_traits<char>>(poVar5);
      lVar11 = 1;
    }
  }
  std::endl<char,std::char_traits<char>>(&local_1a8);
  poVar5 = std::operator<<(&local_1a8,local_218);
  poVar5 = std::operator<<(poVar5,"out ");
  poVar5 = std::operator<<(poVar5,local_210);
  poVar5 = std::operator<<(poVar5,"fs_in_color");
  poVar5 = std::operator<<(poVar5,";");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(&local_1a8);
  std::operator<<(&local_1a8,"void main()\n{\n    gl_Position = gl_in[0].gl_Position;\n");
  std::operator<<(&local_1a8,(string *)&sampling_code);
  poVar5 = std::operator<<(&local_1a8,"}");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_tesselation_evaluation_shader_code,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::__cxx11::string::~string((string *)&sampling_code);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode(
	const samplerType& sampler_type, const samplingFunction& sampling_function,
	std::string& out_tesselation_evaluation_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;
	const glw::GLchar*		   prev_stage_output = (glu::isContextTypeES(m_context.getRenderContext().getType())) ?
											   tesselation_control_shader_output :
											   vertex_shader_output;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble, extension : require */
	stream << shader_code_preamble << tesselation_shader_extension << shader_precision << std::endl
		   << "/* Sampling tesselation evaluation shader */" << std::endl;

	/* layout(point_mode) in; */
	stream << tesselation_evaluation_shader_layout;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in type attribute[]*/
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << prev_stage_output
			   << routine_attribute_definitions[i].name << "[];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << prev_stage_output
			   << type_attribute_definitions[i].name << "[];" << std::endl;
	}

	stream << std::endl;

	/* out vec4 tes_in_color */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << tesselation_evaluation_shader_sampling_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_tesselation_evaluation_shader_code = stream.str();
}